

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O2

any __thiscall
cs_impl::
cni_helper<cs_impl::any(*)(cs::numeric_const&,cs_impl::any_const&,std::deque<cs_impl::any,std::allocator<cs_impl::any>>const&),cs_impl::any(*)(cs::numeric_const&,cs_impl::any_const&,std::deque<cs_impl::any,std::allocator<cs_impl::any>>const&)>
::_call<0,1,2>(cni_helper<cs_impl::any(*)(cs::numeric_const&,cs_impl::any_const&,std::deque<cs_impl::any,std::allocator<cs_impl::any>>const&),cs_impl::any(*)(cs::numeric_const&,cs_impl::any_const&,std::deque<cs_impl::any,std::allocator<cs_impl::any>>const&)>
               *this,vector *args,sequence<0,_1,_2> *param_2)

{
  long lVar1;
  numeric *__args_1;
  undefined8 local_30;
  
  __args_1 = try_convert_and_check<const_cs::numeric_&,_const_cs::numeric_&,_cs::numeric,_0UL>::
             convert(*(var **)param_2);
  lVar1 = *(long *)param_2;
  try_convert_and_check<const_std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_&,_const_std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_&,_std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>,_2UL>
  ::convert((var *)(lVar1 + 0x10));
  std::
  function<cs_impl::any_(const_cs::numeric_&,_const_cs_impl::any_&,_const_std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>
  ::operator()((function<cs_impl::any_(const_cs::numeric_&,_const_cs_impl::any_&,_const_std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>
                *)&stack0xffffffffffffffd0,(numeric *)args,(any *)__args_1,
               (deque<cs_impl::any,_std::allocator<cs_impl::any>_> *)(lVar1 + 8));
  *(undefined8 *)this = local_30;
  local_30 = (void *)0x0;
  any::recycle((any *)&stack0xffffffffffffffd0);
  return (any)(proxy *)this;
}

Assistant:

_Source_RetT _call(cs::vector &args, const cov::sequence<S...> &) const
		{
			return type_convertor<_Target_RetT, _Source_RetT>::convert(
			           mFunc(try_convert<_Target_ArgsT, _Source_ArgsT, S>::convert(args[S])...));
		}